

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[39],kj::String,char_const(&)[9],kj::String,kj::String,char>
          (String *__return_storage_ptr__,kj *this,char (*params) [39],String *params_1,
          char (*params_2) [9],String *params_3,String *params_4,char *params_5)

{
  char *pcVar1;
  char *pcVar2;
  undefined7 in_stack_ffffffffffffff80;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  
  local_48 = toCharSequence<char_const(&)[39]>((char (*) [39])this);
  pcVar1 = *(char **)(*params + 8);
  local_58.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_58.ptr = *(char **)*params;
  }
  pcVar2 = (char *)0x0;
  local_58.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_58.size_ = (size_t)pcVar2;
  }
  local_68 = toCharSequence<char_const(&)[9]>((char (*) [9])params_1);
  pcVar1 = *(char **)(*params_2 + 8);
  local_78.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_78.ptr = *(char **)*params_2;
  }
  local_78.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_78.size_ = (size_t)pcVar2;
  }
  pcVar1 = (char *)(params_3->content).size_;
  local_38.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_38.ptr = (params_3->content).ptr;
  }
  local_38.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_38.size_ = (size_t)pcVar2;
  }
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_48,&local_58,&local_68,&local_78,&local_38,
             (ArrayPtr<const_char> *)&stack0xffffffffffffff87,
             (FixedArray<char,_1UL> *)
             CONCAT17(*(undefined1 *)&(params_4->content).ptr,in_stack_ffffffffffffff80));
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}